

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O2

Dec_Graph_t * Dec_GraphCreate(int nLeaves)

{
  Dec_Graph_t *pDVar1;
  Dec_Node_t *pDVar2;
  
  pDVar1 = (Dec_Graph_t *)calloc(1,0x20);
  pDVar1->nLeaves = 4;
  pDVar1->nSize = 4;
  pDVar1->nCap = 0x3a;
  pDVar2 = (Dec_Node_t *)malloc(0x570);
  pDVar1->pNodes = pDVar2;
  pDVar2->eEdge0 = (Dec_Edge_t)0x0;
  pDVar2->eEdge1 = (Dec_Edge_t)0x0;
  (pDVar2->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2->field_0x10 = 0;
  pDVar2[1].eEdge0 = (Dec_Edge_t)0x0;
  pDVar2[1].eEdge1 = (Dec_Edge_t)0x0;
  pDVar2[1].field_2.pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2[1].field_0x10 = 0;
  pDVar2[2].eEdge0 = (Dec_Edge_t)0x0;
  pDVar2[2].eEdge1 = (Dec_Edge_t)0x0;
  pDVar2[2].field_2.pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2[2].field_0x10 = 0;
  pDVar2[3].eEdge0 = (Dec_Edge_t)0x0;
  pDVar2[3].eEdge1 = (Dec_Edge_t)0x0;
  pDVar2[3].field_2.pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2[3].field_0x10 = 0;
  return pDVar1;
}

Assistant:

static inline Dec_Graph_t * Dec_GraphCreate( int nLeaves )   
{
    Dec_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Dec_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Dec_Graph_t) );
    pGraph->nLeaves = nLeaves;
    pGraph->nSize = nLeaves;
    pGraph->nCap = 2 * nLeaves + 50;
    pGraph->pNodes = ABC_ALLOC( Dec_Node_t, pGraph->nCap );
    memset( pGraph->pNodes, 0, sizeof(Dec_Node_t) * pGraph->nSize );
    return pGraph;
}